

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printT2AddrModeImm8s4Operand(MCInst *MI,uint OpNum,SStream *O,_Bool AlwaysPrintImm0)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  MCOperand *op;
  cs_struct *h;
  int64_t iVar4;
  byte in_CL;
  MCInst *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  bool bVar5;
  _Bool isSub;
  int32_t OffImm;
  MCOperand *MO2;
  MCOperand *MO1;
  char *in_stack_ffffffffffffffb8;
  cs_struct *s;
  MCInst *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffe0;
  MCInst *ss;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = in_CL & 1;
  op = MCInst_getOperand(in_RDI,in_ESI);
  h = (cs_struct *)MCInst_getOperand(in_RDI,in_ESI + 1);
  _Var2 = MCOperand_isReg(op);
  if (_Var2) {
    SStream_concat0((SStream *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    set_mem_access(in_stack_ffffffffffffffc0,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
    s = in_RDI->csh;
    ss = in_RDX;
    MCOperand_getReg(op);
    printRegName(h,(SStream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (uint)((ulong)in_RDX >> 0x20));
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      uVar3 = MCOperand_getReg(op);
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar3;
    }
    iVar4 = MCOperand_getImm((MCOperand *)h);
    uVar3 = (uint)iVar4;
    bVar5 = (int)uVar3 < 0;
    if (uVar3 == 0x80000000) {
      uVar3 = 0;
    }
    if (bVar5) {
      SStream_concat((SStream *)ss,", #-0x%x",(ulong)-uVar3);
    }
    else if (((bVar1 & 1) != 0) || (0 < (int)uVar3)) {
      if ((int)uVar3 < 10) {
        SStream_concat((SStream *)ss,", #%u",(ulong)uVar3);
      }
      else {
        SStream_concat((SStream *)ss,", #0x%x",(ulong)uVar3);
      }
    }
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x51) = uVar3;
    }
    SStream_concat0((SStream *)in_RDX,(char *)s);
    set_mem_access(in_RDX,SUB81((ulong)s >> 0x38,0));
  }
  else {
    printOperand((MCInst *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint)((ulong)in_RDX >> 0x20),
                 (SStream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

static void printT2AddrModeImm8s4Operand(MCInst *MI,
		unsigned OpNum, SStream *O, bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	int32_t OffImm;
	bool isSub;

	if (!MCOperand_isReg(MO1)) {   //  For label symbolic references.
		printOperand(MI, OpNum, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);

	OffImm = (int32_t)MCOperand_getImm(MO2);
	isSub = OffImm < 0;

	//assert(((OffImm & 0x3) == 0) && "Not a valid immediate!");

	// Don't print +0.
	if (OffImm == INT32_MIN)
		OffImm = 0;
	if (isSub) {
		SStream_concat(O, ", #-0x%x", -OffImm);
	} else if (AlwaysPrintImm0 || OffImm > 0) {
		if (OffImm > HEX_THRESHOLD)
			SStream_concat(O, ", #0x%x", OffImm);
		else
			SStream_concat(O, ", #%u", OffImm);
	}
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = OffImm;

	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}